

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmUmdTranslationTable.h
# Opt level: O0

void __thiscall GmmLib::MidLevelTable::~MidLevelTable(MidLevelTable *this)

{
  LastLevelTable *pLVar1;
  LastLevelTable **ppLVar2;
  LastLevelTable *nextItem;
  LastLevelTable *item;
  MidLevelTable *this_local;
  
  if (this->pTTL1 != (LastLevelTable *)0x0) {
    pLVar1 = this->pTTL1;
    while (nextItem = pLVar1, nextItem != (LastLevelTable *)0x0) {
      ppLVar2 = LastLevelTable::Next(nextItem);
      pLVar1 = *ppLVar2;
      if (nextItem != (LastLevelTable *)0x0) {
        LastLevelTable::~LastLevelTable(nextItem);
        operator_delete(nextItem);
      }
    }
    this->pTTL1 = (LastLevelTable *)0x0;
  }
  return;
}

Assistant:

~MidLevelTable()
        {
            if (pTTL1)
            {
                LastLevelTable* item = pTTL1;

                while (item)
                {
                    LastLevelTable* nextItem = item->Next();
                    delete item;
                    item = nextItem;
                }

                pTTL1 = NULL;
            }
        }